

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O1

void __thiscall
ExchangeCompilation_TwoDefinitions_Test::TestBody(ExchangeCompilation_TwoDefinitions_Test *this)

{
  size_t *psVar1;
  uint64_t *puVar2;
  digest d;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  last_member;
  extent<pstore::repo::fragment> x;
  extent<pstore::repo::fragment> x_00;
  undefined8 uVar3;
  element_type *peVar4;
  shared_ptr<const_pstore::repo::compilation> sVar5;
  element_type *peVar6;
  uint generation;
  mapped_type *pmVar7;
  string *psVar8;
  parser<pstore::exchange::import_ns::callbacks> *ppVar9;
  ostream *poVar10;
  pointer *__ptr_3;
  database *pdVar11;
  char *pcVar12;
  pointer *__ptr;
  __shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> _Var13;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  initializer_list<pstore::repo::definition> __l;
  AssertionResult gtest_ar_1;
  vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> definitions;
  undefined1 local_4d0 [8];
  shared_ptr<const_pstore::repo::compilation> compilation;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  mock_mutex mutex;
  extent<pstore::repo::compilation> compilation_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  index_pointer local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  index_pointer iStack_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e0;
  index_pointer iStack_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  _Alloc_hider _Stack_3c8;
  element_type *local_3c0;
  undefined1 local_3b8 [8];
  mock_mutex mutex_1;
  digest fragment_digest;
  const_iterator pos;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  char *triple;
  char *name2;
  char *name1;
  digest compilation_digest;
  string_mapping imported_names;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  string_mapping exported_names;
  ostringstream exported_fragment_stream;
  ostringstream exported_compilation_stream;
  ostringstream exported_names_stream;
  array<const_char_*,_3UL> names;
  
  name1 = "name1";
  name2 = "name2";
  triple = "triple";
  names._M_elems[2] = "name2";
  names._M_elems[0] = "triple";
  names._M_elems[1] = "name1";
  indir_strings._M_h._M_buckets = &indir_strings._M_h._M_single_bucket;
  indir_strings._M_h._M_bucket_count = 1;
  indir_strings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indir_strings._M_h._M_element_count = 0;
  indir_strings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indir_strings._M_h._M_rehash_policy._M_next_resize = 0;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pdVar11 = &(this->super_ExchangeCompilation).export_db_;
  out.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out.container = &indir_strings;
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar11,names._M_elems,(char **)&stack0xffffffffffffffd0,out);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            (&exported_names,pdVar11);
  pstore::exchange::export_ns::ostream_base::ostream_base
            (&exported_names_stream.super_ostream_base,0x1000);
  exported_names_stream.str_._M_dataplus._M_p = (pointer)&exported_names_stream.str_.field_2;
  exported_names_stream.super_ostream_base._vptr_ostream_base =
       (_func_int **)&PTR__ostringstream_00243498;
  exported_names_stream.str_._M_string_length = 0;
  exported_names_stream.str_.field_2._M_local_buf[0] = '\0';
  generation = pstore::database::get_current_revision(pdVar11);
  psVar1 = &pos.visited_parents_.c_._M_elems[0].position;
  pos.db_ = (database_reference)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pos);
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            (&exported_names_stream.super_ostream_base,(indent)0x0,pdVar11,generation,(string *)&pos
             ,&exported_names,false);
  if (pos.db_ != (database_reference)psVar1) {
    operator_delete(pos.db_,pos.visited_parents_.c_._M_elems[0].position + 1);
  }
  compilation_digest.v_._0_8_ = 0x9abcdef0;
  compilation_digest.v_._8_8_ = 0x12345678;
  fragment_digest.v_._0_8_ = (address)0x12345678;
  fragment_digest.v_._8_8_ = (database *)0x9abcdef0;
  pstore::exchange::export_ns::ostream_base::ostream_base
            (&exported_compilation_stream.super_ostream_base,0x1000);
  exported_compilation_stream.str_._M_dataplus._M_p =
       (pointer)&exported_compilation_stream.str_.field_2;
  exported_compilation_stream.super_ostream_base._vptr_ostream_base =
       (_func_int **)&PTR__ostringstream_00243498;
  exported_compilation_stream.str_._M_string_length = 0;
  exported_compilation_stream.str_.field_2._M_local_buf[0] = '\0';
  pstore::exchange::export_ns::ostream_base::ostream_base
            (&exported_fragment_stream.super_ostream_base,0x1000);
  exported_fragment_stream.str_._M_dataplus._M_p = (pointer)&exported_fragment_stream.str_.field_2;
  exported_fragment_stream.super_ostream_base._vptr_ostream_base =
       (_func_int **)&PTR__ostringstream_00243498;
  exported_fragment_stream.str_._M_string_length = 0;
  exported_fragment_stream.str_.field_2._M_local_buf[0] = '\0';
  pos.db_ = (database_reference)&mutex_1;
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 0;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&pos);
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,pdVar11,(lock_type *)&pos
            );
  if ((pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ == '\x01') &&
     (pos.db_ != (database_reference)0x0)) {
    pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 0;
  }
  compilation_1.addr.a_.a_._0_2_ = 0x102;
  memset(&compilation_1.size,0,0xa0);
  local_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_3e8.internal_ = (internal_node *)0x0;
  local_3e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iStack_3d8.internal_ = (internal_node *)0x0;
  local_3d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_3c8._M_p = (pointer)0x0;
  compilation_1.addr.a_.a_._1_1_ = 4;
  local_3f8.internal_ = (internal_node *)local_490;
  pstore::small_vector<unsigned_char,_128UL>::resize
            ((small_vector<unsigned_char,_128UL> *)&compilation_1.size,0x80);
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 2;
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__section_creation_dispatcher_00244c68;
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gtest_ar_1._0_8_ = &compilation_1;
  pstore::gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant
            ((not_null<const_pstore::repo::section_content_*> *)&gtest_ar_1);
  uVar3 = gtest_ar_1._0_8_;
  pstore::repo::bss_section_creation_dispatcher::validate
            ((not_null<const_pstore::repo::section_content_*>)gtest_ar_1._0_8_);
  definitions.
  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)uVar3;
  _Var13 = (__shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>)
           pstore::repo::fragment::
           alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::repo::bss_section_creation_dispatcher*>
                     ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,
                      (bss_section_creation_dispatcher *)&definitions,
                      (bss_section_creation_dispatcher *)local_4d0);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&compilation_index,
             (database *)
             imported_names.adder_.views_.
             super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,true);
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)fragment_digest.v_._0_8_
  ;
  transaction.super_transaction_base.db_ = fragment_digest.v_._8_8_;
  transaction.super_transaction_base._16_16_ = _Var13;
  pstore::index::
  hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
  ::insert_or_upsert<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
            ((pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
              *)&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                      *)compilation_index.
                        super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(transaction_base *)&imported_names,
             (pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)&transaction,false);
  if ((__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
       )pos.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
       )0x0) {
    operator_delete((void *)pos.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                            ._M_head_impl,0x20);
  }
  pos.pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
          )0x0;
  if (compilation_index.
      super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (compilation_index.
               super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pstore::repo::section_creation_dispatcher::~section_creation_dispatcher
            ((section_creation_dispatcher *)&definitions);
  if (iStack_3d8.internal_ != (internal_node *)0x0) {
    operator_delete(iStack_3d8.internal_,(long)_Stack_3c8._M_p - (long)iStack_3d8);
  }
  if (local_3f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_3f0._M_pi,(long)local_3e0._M_pi - (long)local_3f0._M_pi);
  }
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_410._M_pi,(long)local_400._M_pi - (long)local_410._M_pi);
  }
  compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> =
       _Var13;
  pstore::database::getro<pstore::repo::fragment,void>
            ((database *)&pos,(extent<pstore::repo::fragment> *)pdVar11);
  pstore::exchange::export_ns::emit_fragment
            (&exported_fragment_stream.super_ostream_base,(indent)0x0,pdVar11,&exported_names,
             (shared_ptr<const_pstore::repo::fragment> *)&pos,false);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(pos.visited_parents_.c_._M_elems[0].node.addr_.a_._1_7_,
               pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(pos.visited_parents_.c_._M_elems[0].node.addr_.a_._1_7_,
                        pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_));
  }
  sVar5.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2> =
       compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>;
  x.size = (uint64_t)fragment_digest.v_._8_8_;
  x.addr.a_.a_ = fragment_digest.v_._0_8_;
  peVar4 = compilation.
           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  compilation_1.addr.a_.a_ = (address)(address)local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compilation_1,"name1","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&compilation_1);
  d.v_._8_8_ = 1;
  d.v_._0_8_ = 4;
  pstore::repo::definition::definition
            ((definition *)&pos,d,x,(typed_address<pstore::indirect_string>)peVar4,
             (linkage)sVar5.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,(visibility)(pmVar7->a_).a_);
  sVar5 = compilation;
  x_00.size = (uint64_t)fragment_digest.v_._8_8_;
  x_00.addr.a_.a_ = fragment_digest.v_._0_8_;
  peVar4 = compilation.
           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar2 = &transaction.super_transaction_base.size_;
  transaction.super_transaction_base._vptr_transaction_base = (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&transaction,"name2","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&transaction);
  pstore::repo::definition::definition
            ((definition *)&pos.visited_parents_.c_._M_elems[2].position,(digest)ZEXT816(5),x_00,
             (typed_address<pstore::indirect_string>)peVar4,
             (linkage)sVar5.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi,(visibility)(pmVar7->a_).a_);
  __l._M_len = 2;
  __l._M_array = (iterator)&pos;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            (&definitions,__l,(allocator_type *)&compilation_index);
  if (transaction.super_transaction_base._vptr_transaction_base != (_func_int **)puVar2) {
    operator_delete(transaction.super_transaction_base._vptr_transaction_base,
                    transaction.super_transaction_base.size_ + 1);
  }
  psVar1 = &pos.visited_parents_.c_._M_elems[0].position;
  if (compilation_1.addr.a_.a_ != (address)local_490) {
    operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
  }
  pos.db_ = (database_reference)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pos,"triple","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&indir_strings,(key_type *)&pos);
  last_member._M_current._1_7_ =
       definitions.
       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
       _M_impl.super__Vector_impl_data._M_finish._1_7_;
  last_member._M_current._0_1_ =
       definitions.
       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
       _M_impl.super__Vector_impl_data._M_finish._0_1_;
  compilation_1 =
       pstore::repo::compilation::
       alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                 ((transaction<std::unique_lock<mock_mutex>_> *)&imported_names,
                  (typed_address<pstore::indirect_string>)(pmVar7->a_).a_,
                  (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                   )definitions.
                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                    ._M_impl.super__Vector_impl_data._M_start,last_member);
  if (pos.db_ != (database_reference)psVar1) {
    operator_delete(pos.db_,pos.visited_parents_.c_._M_elems[0].position + 1);
  }
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)&pos,(extent<pstore::repo::compilation> *)pdVar11);
  pcVar12 = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            (&exported_compilation_stream.super_ostream_base,(indent)0x0,pdVar11,
             (compilation *)pos.db_,&exported_names,false);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(pos.visited_parents_.c_._M_elems[0].node.addr_.a_._1_7_,
               pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(pos.visited_parents_.c_._M_elems[0].node.addr_.a_._1_7_,
                        pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_));
  }
  pstore::transaction_base::commit((transaction_base *)&imported_names);
  if (definitions.
      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(definitions.
                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback((transaction_base *)&imported_names);
  if (((char)imported_names.views_.
             super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
             ._M_impl._M_node.super__List_node_base._M_next == '\x01') &&
     (imported_names.strings_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0)) {
    imported_names.views_.
    super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         ((ulong)imported_names.views_.
                 super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next & 0xffffffffffffff00);
  }
  pos.db_ = (database_reference)&mutex;
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 0;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)&pos);
  pdVar11 = &(this->super_ExchangeCompilation).import_db_;
  pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,pdVar11,(lock_type *)&pos);
  if ((pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ == '\x01') &&
     (pos.db_ != (database_reference)0x0)) {
    pos.visited_parents_.c_._M_elems[0].node.addr_.a_._0_1_ = 0;
  }
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  anon_unknown.dwarf_a8e0c::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&pos,&transaction,&imported_names);
  psVar8 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
  ppVar9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar9);
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            CONCAT71(compilation_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr._1_7_,pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0);
  compilation_index.
  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
    psVar1 = &pos.visited_parents_.c_._M_elems[8].position;
    if ((size_t *)pos.visited_parents_.c_._M_elems[7].position != psVar1) {
      operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                      pos.visited_parents_.c_._M_elems[8].position + 1);
    }
    if (pos.visited_parents_.c_._M_elems[6].position != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pos.visited_parents_.c_._M_elems[6].position);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)&pos.visited_parents_);
    if (pos.db_ != (database_reference)0x0) {
      operator_delete(pos.db_,0x68);
    }
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)transaction.super_transaction_base.db_;
    pstore::gsl::not_null<pstore::database_*>::ensure_invariant
              ((not_null<pstore::database_*> *)&compilation_index);
    pstore::exchange::import_ns::callbacks::
    make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,pstore::uint128_const*>
              ((callbacks *)&definitions,
               (not_null<pstore::database_*>)
               compilation_index.
               super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&transaction,&imported_names,&fragment_digest);
    compilation_1.size =
         CONCAT71(definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    compilation_1.addr.a_.a_ =
         (address)(address)definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if (compilation_1.size != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(compilation_1.size + 8) = *(int *)(compilation_1.size + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(compilation_1.size + 8) = *(int *)(compilation_1.size + 8) + 1;
      }
    }
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&pos,(callbacks *)&compilation_1,
               none);
    if (compilation_1.size != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)compilation_1.size);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT71(definitions.
                 super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                 definitions.
                 super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                          definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_1_));
    }
    psVar8 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_fragment_stream);
    ppVar9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar8);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar9);
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT71(compilation_index.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._1_7_,pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0);
    compilation_index.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
      if ((size_t *)pos.visited_parents_.c_._M_elems[7].position != psVar1) {
        operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                        pos.visited_parents_.c_._M_elems[8].position + 1);
      }
      if (pos.visited_parents_.c_._M_elems[6].position != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   pos.visited_parents_.c_._M_elems[6].position);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)&pos.visited_parents_);
      if (pos.db_ != (database_reference)0x0) {
        operator_delete(pos.db_,0x68);
      }
      pstore::index::
      get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&compilation_index,pdVar11,true);
      anon_unknown.dwarf_a8e0c::import_compilation_parser
                ((parser<pstore::exchange::import_ns::callbacks> *)&pos,&transaction,&imported_names
                 ,(shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                   *)&compilation_index,&compilation_digest);
      psVar8 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                         (&exported_compilation_stream);
      ppVar9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                         ((parser<pstore::exchange::import_ns::callbacks> *)&pos,psVar8);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar9);
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_1_ = pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0;
      compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_ == 0) {
        if ((size_t *)pos.visited_parents_.c_._M_elems[7].position != psVar1) {
          operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                          pos.visited_parents_.c_._M_elems[8].position + 1);
        }
        if (pos.visited_parents_.c_._M_elems[6].position != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     pos.visited_parents_.c_._M_elems[6].position);
        }
        std::
        deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
        ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                  *)&pos.visited_parents_);
        if (pos.db_ != (database_reference)0x0) {
          operator_delete(pos.db_,0x68);
        }
        if (compilation_index.
            super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (compilation_index.
                     super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        pstore::index::
        get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                  ((index *)&compilation_index,pdVar11,true);
        pstore::index::
        hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
        ::find<pstore::uint128,void>
                  (&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                         *)compilation_index.
                           super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,pdVar11,&compilation_digest);
        peVar6 = compilation_index.
                 super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        memset(&compilation_1.size,0,0xd8);
        compilation_1.addr.a_.a_ = (address)(address)pdVar11;
        local_3c0 = peVar6;
        local_3b8 = (undefined1  [8])0x0;
        testing::internal::
        CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
                  ((internal *)&definitions,"pos","compilation_index->end (import_db_)",&pos,
                   (iterator_base<false> *)&compilation_1);
        if (local_3b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_3b8,0x20);
        }
        if ((char)definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&compilation_1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)compilation_1.addr.a_.a_ + 0x10),
                     "Compilation was not found in the index after import",0x33);
          pcVar12 = "";
          if ((undefined8 *)
              CONCAT71(definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) != (undefined8 *)0x0) {
            pcVar12 = *(char **)CONCAT71(definitions.
                                         super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                         definitions.
                                         super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&compilation,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,0x128,pcVar12);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&compilation,(Message *)&compilation_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&compilation);
          if (compilation_1.addr.a_.a_ != 0) {
            (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&definitions.
                             super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_));
          }
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                       definitions.
                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                       ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&definitions.
                             super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_));
          }
          pstore::index::
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::iterator_base<true>::operator*(&pos);
          pstore::database::getro<pstore::repo::compilation,void>
                    ((database *)&compilation,(extent<pstore::repo::compilation> *)pdVar11);
          pstore::indirect_string::read
                    ((int)&definitions,pdVar11,
                     ((compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->triple_).a_.a_);
          pstore::indirect_string::to_string_abi_cxx11_
                    ((string *)&compilation_1,(indirect_string *)&definitions);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                    ((internal *)&gtest_ar_1,"load_string (import_db_, compilation->triple ())",
                     "triple",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &compilation_1,&triple);
          if (compilation_1.addr.a_.a_ != (address)local_490) {
            operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1)
            ;
          }
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&compilation_1);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar12 = "";
            }
            else {
              pcVar12 = *(char **)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&definitions,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,300,pcVar12);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&definitions,(Message *)&compilation_1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&definitions);
            if (compilation_1.addr.a_.a_ != 0) {
              (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
            }
          }
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_1.message_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
          }
          definitions.
          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(definitions.
                                 super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (compilation.
                                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->size_);
          gtest_ar_1._0_4_ = 2;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&compilation_1,"compilation->size ()","2U",(uint *)&definitions,
                     (uint *)&gtest_ar_1);
          if ((char)compilation_1.addr.a_.a_ == '\0') {
            testing::Message::Message((Message *)&definitions);
            if (compilation_1.size == 0) {
              pcVar12 = "";
            }
            else {
              pcVar12 = *(char **)compilation_1.size;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,0x12d,pcVar12);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
            if (definitions.
                super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (**(code **)((long)((definitions.
                                   super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
          }
          else {
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            peVar4 = compilation.
                     super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            if ((compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_ == 0) {
              pstore::assert_failed
                        ("i < size_",
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                         ,0xa9);
            }
            testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                      ((internal *)&compilation_1,"def1.digest","fragment_digest",
                       &(compilation.
                         super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->members_[0].digest,&fragment_digest);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x130,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            pstore::indirect_string::read((int)&definitions,pdVar11,peVar4->members_[0].name.a_.a_);
            pstore::indirect_string::to_string_abi_cxx11_
                      ((string *)&compilation_1,(indirect_string *)&definitions);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                      ((internal *)&gtest_ar_1,"load_string (import_db_, def1.name)","name1",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &compilation_1,&name1);
            if (compilation_1.addr.a_.a_ != (address)local_490) {
              operator_delete((void *)compilation_1.addr.a_.a_,
                              local_490[0]._M_allocated_capacity + 1);
            }
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)&compilation_1);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&definitions,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x131,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&definitions,(Message *)&compilation_1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&definitions);
              if (compilation_1.addr.a_.a_ != 0) {
                (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
              }
            }
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1.message_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    peVar4->members_[0].field_3.bf) & 0xffffffffffffff0f);
            gtest_ar_1.success_ = true;
            testing::internal::CmpHelperEQ<pstore::repo::linkage,pstore::repo::linkage>
                      ((internal *)&compilation_1,"def1.linkage ()",
                       "pstore::repo::linkage::external",(linkage *)&definitions,
                       &gtest_ar_1.success_);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x132,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    peVar4->members_[0].field_3.bf >> 4) & 0xffffffffffffff03);
            gtest_ar_1.success_ = true;
            testing::internal::CmpHelperEQ<pstore::repo::visibility,pstore::repo::visibility>
                      ((internal *)&compilation_1,"def1.visibility ()",
                       "pstore::repo::visibility::hidden_vis",(visibility *)&definitions,
                       &gtest_ar_1.success_);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x133,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            peVar4 = compilation.
                     super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            if ((compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_ < 2) {
              pstore::assert_failed
                        ("i < size_",
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                         ,0xa9);
            }
            testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
                      ((internal *)&compilation_1,"def2.digest","fragment_digest",
                       (uint128 *)
                       (compilation.
                        super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 1),&fragment_digest);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x137,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            pstore::indirect_string::read
                      ((int)&definitions,pdVar11,(size_t)peVar4[1].members_[0].digest.v_);
            pstore::indirect_string::to_string_abi_cxx11_
                      ((string *)&compilation_1,(indirect_string *)&definitions);
            testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                      ((internal *)&gtest_ar_1,"load_string (import_db_, def2.name)","name2",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &compilation_1,&name2);
            if (compilation_1.addr.a_.a_ != (address)local_490) {
              operator_delete((void *)compilation_1.addr.a_.a_,
                              local_490[0]._M_allocated_capacity + 1);
            }
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)&compilation_1);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&definitions,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x138,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&definitions,(Message *)&compilation_1);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&definitions);
              if (compilation_1.addr.a_.a_ != 0) {
                (**(code **)(*(long *)compilation_1.addr.a_.a_ + 8))();
              }
            }
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1.message_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    *(undefined1 *)((long)&peVar4[1].members_[0].digest.v_ + 8)) &
                          0xffffffffffffff0f);
            gtest_ar_1.success_ = true;
            testing::internal::CmpHelperEQ<pstore::repo::linkage,pstore::repo::linkage>
                      ((internal *)&compilation_1,"def2.linkage ()",
                       "pstore::repo::linkage::link_once_any",(linkage *)&definitions,
                       &gtest_ar_1.success_);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x139,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)(CONCAT71(definitions.
                                    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    *(byte *)((long)&peVar4[1].members_[0].digest.v_ + 8) >> 4) &
                          0xffffffffffffff03);
            gtest_ar_1._0_8_ = gtest_ar_1._0_8_ & 0xffffffffffffff00;
            testing::internal::CmpHelperEQ<pstore::repo::visibility,pstore::repo::visibility>
                      ((internal *)&compilation_1,"def2.visibility ()",
                       "pstore::repo::visibility::default_vis",(visibility *)&definitions,
                       &gtest_ar_1.success_);
            if ((char)compilation_1.addr.a_.a_ == '\0') {
              testing::Message::Message((Message *)&definitions);
              if (compilation_1.size == 0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = *(char **)compilation_1.size;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x13a,pcVar12);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1,(Message *)&definitions);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
              if (definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (**(code **)((long)((definitions.
                                     super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->digest).v_ + 8))();
              }
            }
            if (compilation_1.size != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&compilation_1.size,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           compilation_1.size);
            }
            pstore::transaction_base::commit(&transaction.super_transaction_base);
          }
          if (compilation.
              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        if ((__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
             )pos.pos_._M_t.
              super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
              .
              super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
             )0x0) {
          operator_delete((void *)pos.pos_._M_t.
                                  super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
                                  ._M_head_impl,0x20);
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar_1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(gtest_ar_1._0_8_ + 0x10),"JSON error was: ",0x10);
        (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
                  (&compilation_1,pos.visited_parents_.c_._M_elems[5].position,
                   pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(gtest_ar_1._0_8_ + 0x10),(char *)compilation_1.addr.a_.a_,
                   compilation_1.size);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(gtest_ar_1._0_8_ + 0x10),(char *)&definitions,1);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(gtest_ar_1._0_8_ + 0x10),(char *)&definitions,1);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&definitions,1)
        ;
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&definitions,1);
        definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(definitions.
                               super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(gtest_ar_1._0_8_ + 0x10),(char *)&definitions,1);
        psVar8 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                           (&exported_compilation_stream);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(gtest_ar_1._0_8_ + 0x10),(psVar8->_M_dataplus)._M_p,
                   psVar8->_M_string_length);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&definitions,(internal *)&compilation,
                   (AssertionResult *)"compilation_parser.has_error ()","true","false",pcVar12);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mutex_1,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0x11e,(char *)definitions.
                                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        testing::internal::AssertHelper::operator=((AssertHelper *)&mutex_1,(Message *)&gtest_ar_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mutex_1);
        if (definitions.
            super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&definitions.
                      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(definitions.
                          super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((definitions.
                                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         digest).v_ + 1));
        }
        if (compilation_1.addr.a_.a_ != (address)local_490) {
          operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
        }
        if (gtest_ar_1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
        }
        if (compilation.
            super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&compilation.
                           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       compilation.
                       super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
        }
        if ((size_t *)pos.visited_parents_.c_._M_elems[7].position != psVar1) {
          operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                          pos.visited_parents_.c_._M_elems[8].position + 1);
        }
        if (pos.visited_parents_.c_._M_elems[6].position != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     pos.visited_parents_.c_._M_elems[6].position);
        }
        std::
        deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
        ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                  *)&pos.visited_parents_);
        if (pos.db_ != (database_reference)0x0) {
          operator_delete(pos.db_,0x68);
        }
      }
      if (compilation_index.
          super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (compilation_index.
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      goto LAB_0013ad2b;
    }
    testing::Message::Message((Message *)&compilation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,"JSON error was: ",0x10);
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&compilation_1,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)compilation_1.addr.a_.a_,compilation_1.size);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &(compilation.
                           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->size_,(char *)&definitions,1);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&definitions,1);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    psVar8 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_fragment_stream);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&definitions,(internal *)&compilation_index,
               (AssertionResult *)"fragment_parser.has_error ()","true","false",pcVar12);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x113,(char *)definitions.
                              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&compilation);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(definitions.
                      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((definitions.
                                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->digest).
                                     v_ + 1));
    }
    if (compilation_1.addr.a_.a_ != (address)local_490) {
      operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
    }
    if (compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)((compilation.
                              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_)._M_elems + 8))();
    }
    if (compilation_index.
        super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&compilation_index.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   compilation_index.
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
    }
    if ((size_t *)pos.visited_parents_.c_._M_elems[7].position != psVar1) {
      operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                      pos.visited_parents_.c_._M_elems[8].position + 1);
    }
    if (pos.visited_parents_.c_._M_elems[6].position != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pos.visited_parents_.c_._M_elems[6].position);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)&pos.visited_parents_);
  }
  else {
    testing::Message::Message((Message *)&compilation);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,"JSON error was: ",0x10);
    (**(code **)(*(long *)pos.visited_parents_.c_._M_elems[5].position + 0x20))
              (&compilation_1,pos.visited_parents_.c_._M_elems[5].position,
               pos.visited_parents_.c_._M_elems[5].node.addr_.a_._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)compilation_1.addr.a_.a_,compilation_1.size);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x28);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &(compilation.
                           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->size_,(char *)&definitions,1);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&definitions,1);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&definitions,1);
    definitions.
    super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(definitions.
                           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(char *)&definitions,1);
    psVar8 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &(compilation.
                 super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->size_,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&definitions,(internal *)&compilation_index,
               (AssertionResult *)"name_parser.has_error ()","true","false",pcVar12);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x10a,(char *)definitions.
                              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&compilation);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (definitions.
        super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&definitions.
                  super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(definitions.
                      super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((definitions.
                                       super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->digest).
                                     v_ + 1));
    }
    if (compilation_1.addr.a_.a_ != (address)local_490) {
      operator_delete((void *)compilation_1.addr.a_.a_,local_490[0]._M_allocated_capacity + 1);
    }
    if (compilation.super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)((compilation.
                              super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_)._M_elems + 8))();
    }
    if (compilation_index.
        super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&compilation_index.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   compilation_index.
                   super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
    }
    if ((size_t *)pos.visited_parents_.c_._M_elems[7].position !=
        &pos.visited_parents_.c_._M_elems[8].position) {
      operator_delete((void *)pos.visited_parents_.c_._M_elems[7].position,
                      pos.visited_parents_.c_._M_elems[8].position + 1);
    }
    if (pos.visited_parents_.c_._M_elems[6].position != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pos.visited_parents_.c_._M_elems[6].position);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)&pos.visited_parents_);
  }
  if (pos.db_ != (database_reference)0x0) {
    operator_delete(pos.db_,0x68);
  }
LAB_0013ad2b:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  transaction.super_transaction_base._vptr_transaction_base =
       (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&transaction.super_transaction_base);
  if ((transaction.lock_._M_owns == true) && (transaction.lock_._M_device != (mutex_type *)0x0)) {
    transaction.lock_._M_owns = false;
  }
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_fragment_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_compilation_stream);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_names_stream);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&exported_names);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&indir_strings._M_h);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, TwoDefinitions) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    constexpr auto * triple = "triple";
    constexpr auto name_index = pstore::trailer::indices::name;

    std::array<pstore::gsl::czstring, 3> names{{triple, name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    // Now build a single fragment and a compilation that references it then export them.
    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    constexpr pstore::index::digest fragment_digest{0x9ABCDEF0, 0x12345678};

    export_ns::ostringstream exported_compilation_stream;
    export_ns::ostringstream exported_fragment_stream;

    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        pstore::extent<pstore::repo::fragment> const fext =
            build_fragment (transaction, fragment_digest);
        emit_fragment (exported_fragment_stream, export_ns::indent{}, export_db_, exported_names,
                       export_db_.getro (fext), comments);

        std::vector<pstore::repo::definition> definitions{
            {fragment_digest, fext, indir_strings[name1], pstore::repo::linkage::external,
             pstore::repo::visibility::hidden_vis},
            {fragment_digest, fext, indir_strings[name2], pstore::repo::linkage::link_once_any,
             pstore::repo::visibility::default_vis},
        };
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }


    // Now begin to export the three pieces: the names, the fragment, and finally the compilation.
    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});


    import_ns::string_mapping imported_names;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();
    }
    {
        auto fragment_parser =
            import_fragment_parser (&transaction, &imported_names, &fragment_digest);
        fragment_parser.input (exported_fragment_stream.str ()).eof ();
        ASSERT_FALSE (fragment_parser.has_error ())
            << "JSON error was: " << fragment_parser.last_error ().message () << ' '
            << fragment_parser.coordinate () << '\n'
            << exported_fragment_stream.str ();
    }
    {
        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();
    }

    // Everything is now imported. Let's check what the resulting compilation record looks like.
    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";

    auto const compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, compilation->triple ()), triple);
    ASSERT_EQ (compilation->size (), 2U);
    {
        pstore::repo::definition const & def1 = (*compilation)[0];
        EXPECT_EQ (def1.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def1.name), name1);
        EXPECT_EQ (def1.linkage (), pstore::repo::linkage::external);
        EXPECT_EQ (def1.visibility (), pstore::repo::visibility::hidden_vis);
    }
    {
        pstore::repo::definition const & def2 = (*compilation)[1];
        EXPECT_EQ (def2.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def2.name), name2);
        EXPECT_EQ (def2.linkage (), pstore::repo::linkage::link_once_any);
        EXPECT_EQ (def2.visibility (), pstore::repo::visibility::default_vis);
    }

    transaction.commit ();
}